

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_impl.h
# Opt level: O3

void __thiscall AddrInfo::AddrInfo(AddrInfo *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService((CService *)this);
  (this->super_CAddress).nTime.__d.__r = 100000000;
  (this->super_CAddress).nServices = NODE_NONE;
  (this->m_last_try).__d.__r = 0;
  (this->m_last_count_attempt).__d.__r = 0;
  CNetAddr::CNetAddr(&this->source);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->m_last_success).__d.__r = 0;
    this->nAttempts = 0;
    this->nRefCount = 0;
    this->fInTried = false;
    this->nRandomPos = -1;
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo() : CAddress(), source()
    {
    }